

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O0

void Imf_3_3::(anonymous_namespace)::checkIsNullTerminated<256ul>(char (*str) [256],char *what)

{
  ostream *poVar1;
  stringstream *text;
  char *in_RSI;
  long in_RDI;
  stringstream s;
  size_t i;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  ulong local_18;
  char *local_10;
  
  local_18 = 0;
  while( true ) {
    if (0xff < local_18) {
      local_10 = in_RSI;
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar1 = std::operator<<(local_190,"Invalid ");
      poVar1 = std::operator<<(poVar1,local_10);
      poVar1 = std::operator<<(poVar1,": it is more than ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xff);
      std::operator<<(poVar1," characters long.");
      text = (stringstream *)__cxa_allocate_exception(0x48);
      Iex_3_3::InputExc::InputExc((InputExc *)poVar1,text);
      __cxa_throw(text,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
    }
    if (*(char *)(in_RDI + local_18) == '\0') break;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void
checkIsNullTerminated (const char (&str)[N], const char* what)
{
    for (size_t i = 0; i < N; ++i)
    {
        if (str[i] == '\0') return;
    }
    std::stringstream s;
    s << "Invalid " << what << ": it is more than " << (N - 1)
      << " characters long.";
    throw IEX_NAMESPACE::InputExc (s);
}